

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

void __thiscall
Centaurus::LookaheadDFA<unsigned_char>::fork_closures
          (LookaheadDFA<unsigned_char> *this,CompositeATN<unsigned_char> *catn,int index)

{
  bool bVar1;
  int iVar2;
  set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  *closure;
  size_type sVar3;
  reference cc;
  NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  *pNVar4;
  uint local_c0;
  uint i;
  int new_index;
  CATNClosure ec;
  int color;
  pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  *item;
  iterator __end0;
  iterator __begin0;
  CATNDepartureSet<unsigned_char> *__range2;
  undefined1 local_48 [4];
  int initial_index;
  CATNDepartureSet<unsigned_char> deptset;
  LDFAState<unsigned_char> *state;
  int index_local;
  CompositeATN<unsigned_char> *catn_local;
  LookaheadDFA<unsigned_char> *this_local;
  
  deptset.
  super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  .
  super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                ::operator[](&(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states,
                             (long)index);
  closure = NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
            ::label((NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                     *)deptset.
                       super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                       .
                       super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  CompositeATN<unsigned_char>::build_departure_set
            ((CATNDepartureSet<unsigned_char> *)local_48,catn,closure);
  sVar3 = std::
          vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
          ::size(&(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states);
  local_c0 = (uint)sVar3;
  __end0 = std::
           vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
           ::begin((vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                    *)&deptset);
  item = (pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
          *)std::
            vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
            ::end((vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                   *)&deptset);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>_>
                                     *)&item), bVar1) {
    cc = __gnu_cxx::
         __normal_iterator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>_>
         ::operator*(&__end0);
    iVar2 = get_closure_color(&cc->second);
    if (iVar2 < 1) {
      CompositeATN<unsigned_char>::build_closure((CATNClosure *)&i,catn,&cc->second);
      iVar2 = add_state(this,(CATNClosure *)&i);
      pNVar4 = &std::
                vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                ::operator[](&(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states,
                             (long)index)->
                super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ;
      NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ::add_transition(pNVar4,&cc->first,iVar2,false);
      std::
      set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
      ::~set((set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
              *)&i);
    }
    else {
      pNVar4 = &std::
                vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                ::operator[](&(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states,
                             (long)index)->
                super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ;
      NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ::add_transition(pNVar4,&cc->first,-iVar2,false);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>_>
    ::operator++(&__end0);
  }
  for (; sVar3 = std::
                 vector<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                 ::size(&(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states),
      local_c0 < sVar3; local_c0 = local_c0 + 1) {
    fork_closures(this,catn,local_c0);
  }
  CATNDepartureSet<unsigned_char>::~CATNDepartureSet((CATNDepartureSet<unsigned_char> *)local_48);
  return;
}

Assistant:

void fork_closures(const CompositeATN<TCHAR>& catn, int index)
	{
		const LDFAState<TCHAR>& state = m_states[index];

		//First, check if the state in question is already single-colored
		/*if (state.get_color() > 0)
		{
			std::cout << "Monochromatic " << index << std::endl;
			return;
		}*/

		CATNDepartureSet<TCHAR> deptset = catn.build_departure_set(state.label());

		/*std::wofstream deptsetLog("deptset.log", std::ios::app);

		deptsetLog << deptset << std::endl;

		deptsetLog.close();*/

		//std::cout << deptset << std::endl;

		//Add new states to the LDFA
		int initial_index = m_states.size();

		for (const auto& item : deptset)
		{
			int color = get_closure_color(item.second);

			if (color > 0)
			{
				m_states[index].add_transition(item.first, -color);
			}
			else
			{
				CATNClosure ec = catn.build_closure(item.second);

				int new_index = add_state(ec);

				m_states[index].add_transition(item.first, new_index);
			}
		}

		//Recursively construct the closures for all the newly added DFA states
		for (unsigned int i = initial_index; i < m_states.size(); i++)
		{
			fork_closures(catn, i);
		}
	}